

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

char * get_line(char *buf,int len,FILE *input)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  size_t sVar3;
  undefined4 in_register_00000034;
  
  __s = fgets(buf,5000,(FILE *)CONCAT44(in_register_00000034,len));
  if (__s != (char *)0x0) {
    bVar2 = false;
    do {
      sVar3 = strlen(__s);
      if (sVar3 == 0) {
        bVar2 = true;
      }
      else {
        bVar1 = (bool)(bVar2 | __s[sVar3 - 1] != '\n');
        bVar2 = __s[sVar3 - 1] != '\n';
        if (!bVar1) {
          return __s;
        }
      }
      __s = fgets(buf,5000,(FILE *)CONCAT44(in_register_00000034,len));
    } while (__s != (char *)0x0);
  }
  return (char *)0x0;
}

Assistant:

static char *get_line(char *buf, int len, FILE *input)
{
  bool partial = FALSE;
  while(1) {
    char *b = fgets(buf, len, input);
    if(b) {
      size_t rlen = strlen(b);
      if(rlen && (b[rlen-1] == '\n')) {
        if(partial) {
          partial = FALSE;
          continue;
        }
        return b;
      }
      /* read a partial, discard the next piece that ends with newline */
      partial = TRUE;
    }
    else
      break;
  }
  return NULL;
}